

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void goto_level(d_level *newlevel,boolean at_stairs,boolean falling,boolean portal)

{
  undefined1 *puVar1;
  char cVar2;
  level *plVar3;
  coord *__s;
  xchar xVar4;
  level *plVar5;
  schar sVar6;
  schar sVar7;
  boolean bVar8;
  xchar xVar9;
  xchar xVar10;
  boolean bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  s_level *psVar15;
  monst *pmVar16;
  obj *poVar17;
  xchar hx;
  long lVar18;
  long lVar19;
  char cVar20;
  uint uVar21;
  d_level *src;
  char *pcVar22;
  char *line;
  xchar hy;
  xchar nlx;
  char cVar23;
  trap *trap;
  obj **obj;
  monst *pmVar24;
  char **ppcVar25;
  coord *__s_00;
  xchar nly;
  xchar nhx;
  xchar nhy;
  xchar rtype;
  coord cc;
  
  sVar6 = depth(newlevel);
  sVar7 = depth(&u.uz);
  xVar4 = u.uz.dnum;
  cVar2 = newlevel->dnum;
  bVar8 = In_W_tower(level,(int)u.ux,(int)u.uy);
  xVar9 = dunlev(newlevel);
  xVar10 = dunlevs_in_dungeon(newlevel);
  if (xVar10 < xVar9) {
    xVar9 = dunlevs_in_dungeon(newlevel);
    newlevel->dlevel = xVar9;
  }
  if ((xVar4 != cVar2) && (newlevel->dnum == dungeon_topology.d_astral_level.dnum)) {
    if ((u.uhave._0_1_ & 1) == 0) {
      return;
    }
    psVar15 = get_first_elemental_plane();
    pline("Well done, mortal!");
    pline("But now thou must face the final Test...");
    pline("Prove thyself worthy or perish!");
    src = &psVar15->dlevel;
    if (psVar15 == (s_level *)0x0) {
      src = (d_level *)0x0;
    }
    assign_level(newlevel,src);
  }
  xVar9 = ledger_no(newlevel);
  if (xVar9 < '\x01') {
    done(0xf);
  }
  bVar11 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if ((bVar11 != '\0' && xVar4 == cVar2) && (bVar11 = ok_to_quest(), bVar11 == '\0')) {
    pline("A mysterious force prevents you from descending.");
    return;
  }
  bVar11 = on_level(newlevel,&u.uz);
  if (bVar11 != '\0') {
    return;
  }
  if (falling != '\0') {
    impact_drop((obj *)0x0,u.ux,u.uy,newlevel->dlevel);
  }
  check_special_room('\x01');
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  u.utrap = 0;
  fill_pit(level,(int)u.ux,(int)u.uy);
  u.ustuck = (monst *)0x0;
  u._1052_1_ = u._1052_1_ & 0x79;
  bVar11 = on_level(newlevel,&dungeon_topology.d_blackmarket_level);
  if (bVar11 == '\0') {
    bVar11 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    if (bVar11 != '\0') {
      pcVar22 = "can\'t follow you through the portal.";
      goto LAB_0016d856;
    }
    iVar13 = 0;
    pcVar22 = (char *)0x0;
  }
  else {
    pcVar22 = "can\'t follow you into the Black Market.";
LAB_0016d856:
    iVar13 = 2;
  }
  keepdogs(iVar13,pcVar22);
  if ((u._1052_1_ & 1) != 0) {
    u._1052_1_ = u._1052_1_ & 0xfe;
    u.uswldtim = 0;
  }
  vision_recalc(2);
  if ((level->flags).purge_monsters != 0) {
    dmonsfree(level);
  }
  update_mlstmv();
  assign_level(&u.uz0,&u.uz);
  assign_level(&u.uz,newlevel);
  assign_level(&u.utolev,newlevel);
  u.utotype = '\0';
  cVar20 = dungeons[u.uz.dnum].entry_lev;
  cVar23 = dungeons[u.uz.dnum].dunlev_ureached;
  xVar10 = dunlev(&u.uz);
  if (cVar20 == '\x01') {
    if (cVar23 < xVar10) {
LAB_0016d91b:
      xVar10 = dunlev(&u.uz);
      dungeons[u.uz.dnum].dunlev_ureached = xVar10;
    }
  }
  else if ((xVar10 < cVar23) || (dungeons[u.uz.dnum].dunlev_ureached == '\0')) goto LAB_0016d91b;
  reset_rndmonst(-1);
  plVar5 = level;
  level = (level *)0x0;
  plVar3 = levels[xVar9];
  if (plVar3 == (level *)0x0) {
    pcVar22 = hist_lev_name(&u.uz,'\0');
    historic_event('\0',"reached %s.",pcVar22);
    level = mklev(&u.uz);
  }
  else {
    pmVar16 = plVar3->monlist;
    level = plVar3;
    while (pmVar16 != (monst *)0x0) {
      pmVar24 = pmVar16->nmon;
      uVar21 = moves - level->lastmoves;
      if ((uint)level->lastmoves <= moves && uVar21 != 0) {
        mon_catchup_elapsed_time(pmVar16,(ulong)uVar21);
      }
      restore_cham(pmVar16);
      pmVar16 = pmVar24;
    }
    catchup_dgn_growths(level,(moves - level->lastmoves) / 5);
  }
  transfer_timers(plVar5,level,0);
  transfer_lights(plVar5,level,0);
  vision_reset();
  vision_full_recalc = '\0';
  flush_screen_disable();
  if ((portal == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
    if ((at_stairs == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
      if ((bVar8 == '\0') || (bVar8 = On_W_tower_level(&u.uz), bVar8 == '\0')) {
        if (sVar6 < sVar7) {
          xVar9 = (level->updest).lx;
          xVar10 = (level->updest).ly;
          hx = (level->updest).hx;
          hy = (level->updest).hy;
          nlx = (level->updest).nlx;
          nly = (level->updest).nly;
          nhx = (level->updest).nhx;
          nhy = (level->updest).nhy;
          rtype = '\x05';
        }
        else {
          xVar9 = (level->dndest).lx;
          xVar10 = (level->dndest).ly;
          hx = (level->dndest).hx;
          hy = (level->dndest).hy;
          nlx = (level->dndest).nlx;
          nly = (level->dndest).nly;
          nhx = (level->dndest).nhx;
          nhy = (level->dndest).nhy;
          rtype = '\x06';
        }
      }
      else {
        xVar9 = (level->dndest).nlx;
        xVar10 = (level->dndest).nly;
        hx = (level->dndest).nhx;
        hy = (level->dndest).nhy;
        nhy = '\0';
        nhx = '\0';
        nly = '\0';
        rtype = '\x06';
        nlx = '\0';
      }
      place_lregion(level,xVar9,xVar10,hx,hy,nlx,nly,nhx,nhy,rtype,(d_level *)0x0);
      if (falling != '\0') {
        if (uball != (obj *)0x0) {
          ballfall();
        }
LAB_0016dc1a:
        selftouch("Falling, you");
      }
    }
    else if (sVar6 < sVar7) {
      if (at_ladder == '\0') {
        if (xVar4 == cVar2) {
          u_on_dnstairs();
        }
        else {
          bVar8 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          plVar5 = level;
          if (bVar8 == '\0') {
            u_on_sstairs();
          }
          else {
            uVar21 = 0;
LAB_0016dc7f:
            do {
              iVar13 = rn2(((int)(plVar5->updest).hx - (int)(plVar5->updest).lx) + 1);
              cVar20 = (char)iVar13 + (plVar5->updest).lx;
              iVar13 = rn2(((int)(plVar5->updest).hy - (int)(plVar5->updest).ly) + 1);
              cVar23 = (char)iVar13 + (plVar5->updest).ly;
              if ((cVar20 < (plVar5->updest).nlx) || ((plVar5->updest).nhx < cVar20)) {
                if ((cVar23 < (plVar5->updest).nly) || ((plVar5->updest).nhy < cVar23))
                goto LAB_0016dc7f;
              }
              bVar8 = occupied(level,cVar20,cVar23);
              if ((bVar8 == '\0') && ('\f' < level->locations[cVar20][cVar23].typ)) {
                if (uVar21 < 1000) goto LAB_0016dd5f;
                break;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != 0x3e9);
            warning("Castle: placement failed to find good pos");
LAB_0016dd5f:
            u_on_newpos((int)cVar20,(int)cVar23);
          }
        }
      }
      else {
        u_on_newpos((int)(level->dnladder).sx,(int)(level->dnladder).sy);
      }
      if ((((uball != (obj *)0x0) && (u.uprops[0x12].intrinsic == 0)) &&
          (u.uprops[0x12].extrinsic == 0)) && ((youmonst.data)->mlet != '\x05')) {
        pcVar22 = "ladder";
        if (at_ladder == '\0') {
          pcVar22 = "stairs";
        }
        line = "With great effort you climb the %s.";
        goto LAB_0016defa;
      }
    }
    else {
      if (at_ladder == '\0') {
        if (xVar4 == cVar2) {
          u_on_upstairs();
        }
        else {
          u_on_sstairs();
        }
      }
      else {
        u_on_newpos((int)(level->upladder).sx,(int)(level->upladder).sy);
      }
      if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
         ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
        iVar13 = near_capacity();
        if ((0 < iVar13) ||
           (((uball != (obj *)0x0 &&
             (((uwep != uball || (u.weapon_skills[0xe].skill < '\x02')) || (urole.malenum != 0x15d))
             )) || ((u.uprops[0x25].intrinsic != 0 || (u.uprops[0x25].extrinsic != 0)))))) {
          pcVar22 = "ladder";
          if (at_ladder == '\0') {
            pcVar22 = "stairs";
          }
          pline("You fall down the %s.",pcVar22);
          if ((uball != (obj *)0x0) && (drag_down(), uball->where == '\x03')) {
            if (uwep == uball) {
              setuwep((obj *)0x0);
            }
            if (uswapwep == uball) {
              setuswapwep((obj *)0x0);
            }
            if (uquiver == uball) {
              setuqwep((obj *)0x0);
            }
            freeinv(uball);
          }
          if (u.usteed == (monst *)0x0) {
            iVar13 = rnd(3);
            losehp(iVar13,"falling downstairs",1);
          }
          else {
            dismount_steed(1);
          }
          goto LAB_0016dc1a;
        }
      }
      else {
        pcVar22 = "ladder";
        if (at_ladder == '\0') {
          pcVar22 = "stairs";
        }
        line = "You fly down along the %s.";
LAB_0016defa:
        pline(line,pcVar22);
      }
    }
  }
  else {
    trap = (trap *)&level->lev_traps;
    do {
      trap = trap->ntrap;
      if (trap == (trap *)0x0) {
        panic("goto_level: no corresponding portal!");
      }
    } while ((trap->field_0x8 & 0x1f) != 0x12);
    seetrap(trap);
    u_on_newpos((int)trap->tx,(int)trap->ty);
  }
  if (uball != (obj *)0x0) {
    placebc();
  }
  while (poVar17 = level->objects[0][0], poVar17 != (obj *)0x0) {
    deliver_object(poVar17,u.uz.dnum,u.uz.dlevel,9);
  }
  obj = &invent;
  while (obj = &((obj *)obj)->nobj->nobj, (obj *)obj != (obj *)0x0) {
    set_obj_level(level,(obj *)obj);
  }
  losedogs();
  kill_genocided_monsters();
  run_timers();
  initrack();
  lVar18 = (long)u.ux;
  lVar19 = (long)u.uy;
  pmVar16 = level->monsters[lVar18][lVar19];
  pmVar24 = (monst *)0x0;
  if ((pmVar16 != (monst *)0x0) && ((pmVar16->field_0x61 & 2) == 0)) {
    pmVar24 = pmVar16;
  }
  if ((pmVar24 != (monst *)0x0) && (pmVar24 != u.usteed)) {
    uVar21 = mt_random();
    if (((uVar21 & 1) == 0) &&
       ((bVar8 = enexto(&cc,level,u.ux,u.uy,youmonst.data), bVar8 != '\0' &&
        (iVar13 = dist2((int)cc.x,(int)cc.y,(int)u.ux,(int)u.uy), iVar13 < 3)))) {
      u_on_newpos((int)cc.x,(int)cc.y);
    }
    else {
      mnexto(pmVar24);
    }
    lVar18 = (long)u.ux;
    lVar19 = (long)u.uy;
    pmVar16 = level->monsters[lVar18][lVar19];
    if ((pmVar16 != (monst *)0x0) && ((pmVar16->field_0x61 & 2) == 0)) {
      impossible("mnexto failed (do.c)?");
      rloc(level,pmVar16,'\0');
      lVar18 = (long)u.ux;
      lVar19 = (long)u.uy;
    }
  }
  puVar1 = &level->locations[lVar18][lVar19].field_0x6;
  *puVar1 = *puVar1 | 4;
  bVar8 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar8 != '\0') {
    movebubbles();
  }
  uVar21 = *(uint *)&(level->flags).field_0x8;
  if ((uVar21 >> 0x16 & 1) != 0) {
    *(uint *)&(level->flags).field_0x8 = uVar21 & 0xffbfffff;
  }
  notify_levelchange((d_level *)0x0);
  vision_reset();
  doredraw();
  flush_screen_enable();
  flush_screen();
  check_special_room('\0');
  bVar8 = In_hell(&u.uz0);
  if ((bVar8 == '\0') && (bVar8 = In_hell(&u.uz), bVar8 != '\0')) {
    bVar8 = on_level(&u.uz,&dungeon_topology.d_valley_level);
    if (bVar8 == '\0') {
      pline("It is hot here.  You smell smoke...");
    }
    else {
      pline("You arrive at the Valley of the Dead...");
      pline("The odor of burnt flesh and decay pervades the air.");
      You_hear("groans and moans everywhere.");
    }
  }
  if ((uVar21 >> 0x16 & 1) != 0) {
    uVar21 = mt_random();
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((ppcVar25 = goto_level::halu_fam_msgs, u.umonnum != u.umonster &&
        (bVar8 = dmgtype(youmonst.data,0x24), bVar8 != '\0')))) {
      ppcVar25 = goto_level::fam_msgs;
    }
    __s = (coord *)ppcVar25[uVar21 & 3];
    if (__s != (coord *)0x0) {
      pcVar22 = strchr((char *)__s,0x25);
      __s_00 = __s;
      if (pcVar22 != (char *)0x0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016e177;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016e16e;
          pcVar22 = "looks";
        }
        else {
LAB_0016e16e:
          if (ublindf == (obj *)0x0) {
            pcVar22 = "seems";
          }
          else {
LAB_0016e177:
            pcVar22 = "seems";
            if (ublindf->oartifact == '\x1d') {
              pcVar22 = "looks";
            }
          }
        }
        __s_00 = &cc;
        sprintf(&__s_00->x,(char *)__s,pcVar22);
      }
      pline(&__s_00->x);
    }
  }
  if ((plVar3 == (level *)0x0) &&
     (bVar8 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar8 != '\0')) {
    pline("You enter what seems to be an older, more primitive world.");
  }
  if ((((plVar3 == (level *)0x0) && (u.uprops[0x23].intrinsic != 0)) &&
      (u.uprops[0x24].extrinsic == 0)) &&
     (((u.umonnum == u.umonster || (bVar8 = dmgtype(youmonst.data,0x24), bVar8 == '\0')) &&
      ((urole.malenum == 0x159 &&
       (bVar8 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar8 != '\0')))))) {
    pline("Ahh, Venice.");
  }
  if ((u.uz.dnum == dungeon_topology.d_astral_level.dnum && xVar4 != cVar2) &&
     ((u.uhave._0_1_ & 1) != 0)) {
    resurrect();
  }
  if ((xVar4 != cVar2) &&
     (((bVar8 = In_V_tower(&u.uz), bVar8 != '\0' || (u.uz.dnum == dungeon_topology.d_dragon_dnum))
      && (bVar8 = In_hell(&u.uz0), bVar8 != '\0')))) {
    pline("The heat and smoke are gone.");
  }
  bVar8 = In_quest(&u.uz0);
  if (((bVar8 == '\0') && (bVar8 = at_dgn_entrance(&u.uz,"The Quest"), bVar8 != '\0')) &&
     (((u.uevent._0_2_ & 0x30) == 0 && ((quest_status._2_1_ & 0x10) == 0)))) {
    if (u.uprops[0x19].blocked == 0) {
      if ((u.uevent._0_2_ & 8) == 0) {
        com_pager(2);
        u.uevent._0_2_ = u.uevent._0_2_ | 8;
      }
      else {
        com_pager((urole.malenum == 0x164) + 3);
      }
    }
    else if (uarmh != (obj *)0x0) {
      pcVar22 = yname(uarmh);
      pline("You sense something being blocked by %s.",pcVar22);
    }
  }
  iVar13 = getmonth();
  if (((iVar13 == 0xc) && (iVar13 = getmday(), iVar13 < 0x19)) &&
     (bVar8 = mk_advcal_portal(level), bVar8 != '\0')) {
    pline("You smell chocolate!");
  }
  bVar8 = on_level(&u.uz,&dungeon_topology.d_advcal_level);
  if (bVar8 != '\0') {
    fill_advent_calendar(level,'\0');
  }
  bVar8 = on_level(&u.uz,&dungeon_topology.d_knox_level);
  if ((bVar8 != '\0') && ((plVar3 == (level *)0x0 || (mvitals[0x129].died == '\0')))) {
    pline("You penetrated a high security area!");
    pline("An alarm sounds!");
    pmVar16 = (monst *)&level->monlist;
    while (pmVar16 = pmVar16->nmon, pmVar16 != (monst *)0x0) {
      if ((0 < pmVar16->mhp) && ((*(uint *)&pmVar16->field_0x60 >> 0x13 & 1) != 0)) {
        *(uint *)&pmVar16->field_0x60 = *(uint *)&pmVar16->field_0x60 & 0xfff7ffff;
      }
    }
  }
  bVar8 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if ((bVar8 != '\0') && (u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0)) {
    set_black_marketeer_angry();
  }
  bVar8 = on_level(&u.uz,&dungeon_topology.d_astral_level);
  if (bVar8 == '\0') {
    onquest();
    goto LAB_0016e737;
  }
  pmVar16 = (monst *)&level->monlist;
  while (pmVar16 = pmVar16->nmon, pmVar16 != (monst *)0x0) {
    if (0 < pmVar16->mhp) {
      reset_hostility(pmVar16);
    }
  }
  uVar21 = mt_random();
  create_mplayers((uVar21 & 3) + 3,'\x01');
  if (u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) {
    pline("A voice booms: \"Thy desire for conflict shall be fulfilled!\"");
    iVar13 = rnd(4);
    for (; 0 < iVar13; iVar13 = iVar13 + -1) {
      cc.x = u.ux;
      cc.y = u.uy;
      bVar8 = enexto(&cc,level,u.ux,u.uy,mons + 0x7f);
      if (bVar8 != '\0') {
        mk_roamer(mons + 0x7f,u.ualign.type,level,cc.x,cc.y,'\0');
      }
    }
    goto LAB_0016e737;
  }
  if (u.ualign.record < 9) goto LAB_0016e737;
  pline("A voice whispers: \"Thou hast been worthy of me!\"");
  cc.x = u.ux;
  cc.y = u.uy;
  bVar8 = enexto(&cc,level,u.ux,u.uy,mons + 0x7f);
  if ((bVar8 == '\0') ||
     (pmVar16 = mk_roamer(mons + 0x7f,u.ualign.type,level,cc.x,cc.y,'\x01'), pmVar16 == (monst *)0x0
     )) goto LAB_0016e737;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016e637;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016e632;
LAB_0016e664:
    pcVar22 = "An angel appears near you.";
  }
  else {
LAB_0016e632:
    if (ublindf != (obj *)0x0) {
LAB_0016e637:
      if (ublindf->oartifact == '\x1d') goto LAB_0016e664;
    }
    pcVar22 = "You feel the presence of a friendly angel near you.";
  }
  pline(pcVar22);
  pmVar16->mtame = '\n';
  uVar21 = mt_random();
  bVar12 = ((byte)uVar21 & 7) + 0xf;
  pmVar16->m_lev = bVar12;
  iVar13 = dice((uint)bVar12,10);
  iVar14 = rnd(0x1e);
  iVar13 = iVar14 + iVar13 + 0x1e;
  pmVar16->mhpmax = iVar13;
  pmVar16->mhp = iVar13;
  poVar17 = select_hwep(pmVar16);
  if (poVar17 == (obj *)0x0) {
    poVar17 = mksobj(level,0x23,'\0','\0');
    iVar13 = mpickobj(pmVar16,poVar17);
    if (iVar13 != 0) {
      panic("merged weapon?");
    }
  }
  bless(poVar17);
  if (poVar17->spe < '\x04') {
    iVar13 = rnd(4);
    poVar17->spe = poVar17->spe + (char)iVar13;
  }
  poVar17 = which_armor(pmVar16,8);
  if ((poVar17 == (obj *)0x0) || (poVar17->otyp != 0x8e)) {
    mongets(pmVar16,0xd0);
    m_dowear(level,pmVar16,'\x01');
  }
LAB_0016e737:
  assign_level(&u.uz0,&u.uz);
  if (level->levname[0] != '\0') {
    pline("You named this level: %s.",level);
  }
  in_out_region(level,u.ux,u.uy);
  pickup(1);
  return;
}

Assistant:

void goto_level(d_level *newlevel, boolean at_stairs, boolean falling, boolean portal)
{
	xchar new_ledger;
	boolean up = (depth(newlevel) < depth(&u.uz)),
		newdungeon = (u.uz.dnum != newlevel->dnum),
		was_in_W_tower = In_W_tower(level, u.ux, u.uy),
		familiar = FALSE;
	boolean new = FALSE;	/* made a new level? */
	struct monst *mtmp, *mtmp2;
	struct obj *otmp;
	struct level *origlev;

	if (dunlev(newlevel) > dunlevs_in_dungeon(newlevel))
		newlevel->dlevel = dunlevs_in_dungeon(newlevel);
	if (newdungeon && In_endgame(newlevel)) { /* 1st Endgame Level !!! */
		if (u.uhave.amulet) {
		    s_level *first_plane = get_first_elemental_plane();
		    pline("Well done, mortal!");
		    pline("But now thou must face the final Test...");
		    pline("Prove thyself worthy or perish!");
		    assign_level(newlevel, first_plane ? &first_plane->dlevel : NULL);
		} else
		    return;
	}
	new_ledger = ledger_no(newlevel);
	if (new_ledger <= 0)
		done(ESCAPED);	/* in fact < 0 is impossible */

	/* Prevent the player from going past the first quest level unless
	 * (s)he has been given the go-ahead by the leader.
	 */
	if (on_level(&u.uz, &qstart_level) && !newdungeon && !ok_to_quest()) {
		pline("A mysterious force prevents you from descending.");
		return;
	}

	if (on_level(newlevel, &u.uz)) return;		/* this can happen */

	if (falling) /* assuming this is only trap door or hole */
	    impact_drop(NULL, u.ux, u.uy, newlevel->dlevel);

	check_special_room(TRUE);		/* probably was a trap door */
	if (Punished) unplacebc();
	u.utrap = 0;				/* needed in level_tele */
	fill_pit(level, u.ux, u.uy);
	u.ustuck = 0;				/* idem */
	u.uwilldrown = 0;
	u.uinwater = 0;
	u.uundetected = 0;	/* not hidden, even if means are available */

	if (Is_blackmarket(newlevel))
	    keepdogs(2, "can't follow you into the Black Market.");
	else if (Is_blackmarket(&u.uz))
	    keepdogs(2, "can't follow you through the portal.");
	else
	    keepdogs(0, NULL);

	if (u.uswallow)				/* idem */
		u.uswldtim = u.uswallow = 0;
	/*
	 *  We no longer see anything on the level->  Make sure that this
	 *  follows u.uswallow set to null since uswallow overrides all
	 *  normal vision.
	 */
	vision_recalc(2);
	
	if (level->flags.purge_monsters) {
		/* purge any dead monsters */
		dmonsfree(level);
	}
	update_mlstmv();	/* current monsters are becoming inactive */
	

	assign_level(&u.uz0, &u.uz);
	assign_level(&u.uz, newlevel);
	assign_level(&u.utolev, newlevel);
	u.utotype = 0;

	/* If the entry level is the top level, then the dungeon goes down.
	 * Otherwise it goes up. */
	if (dungeons[u.uz.dnum].entry_lev == 1) {
	    if (dunlev_reached(&u.uz) < dunlev(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	} else {
	    if (dunlev_reached(&u.uz) > dunlev(&u.uz) || !dunlev_reached(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	}

	reset_rndmonst(NON_PM);   /* u.uz change affects monster generation */

	origlev = level;
	level = NULL;
	
	if (!levels[new_ledger]) {
		/* entering this level for first time; make it now */
		historic_event(FALSE, "reached %s.", hist_lev_name(&u.uz, FALSE));
		level = mklev(&u.uz);
		new = TRUE;	/* made the level */
	} else {
		/* returning to previously visited level */
		level = levels[new_ledger];

		/* regenerate animals while on another level */
		for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
			mtmp2 = mtmp->nmon;
			if (moves > level->lastmoves)
				mon_catchup_elapsed_time(mtmp, moves - level->lastmoves);

			/* update shape-changers in case protection against
			   them is different now */
			restore_cham(mtmp);
		}

		/* grow herbs and/or trees while on another level */
		catchup_dgn_growths(level, (moves - level->lastmoves) / 5);
	}

	/* some timers and lights might need to be transferred to the new level
	 * if they are attached to objects the hero is carrying */
	transfer_timers(origlev, level, 0);
	transfer_lights(origlev, level, 0);

	/* do this prior to level-change pline messages */
	vision_reset();		/* clear old level's line-of-sight */
	vision_full_recalc = 0;	/* don't let that reenable vision yet */
	flush_screen_disable();	/* ensure all map flushes are postponed */

	if (portal && !In_endgame(&u.uz)) {
	    /* find the portal on the new level */
	    struct trap *ttrap;

	    for (ttrap = level->lev_traps; ttrap; ttrap = ttrap->ntrap)
		if (ttrap->ttyp == MAGIC_PORTAL) break;

	    if (!ttrap) panic("goto_level: no corresponding portal!");
	    seetrap(ttrap);
	    u_on_newpos(ttrap->tx, ttrap->ty);
	} else if (at_stairs && !In_endgame(&u.uz)) {
	    if (up) {
		if (at_ladder) {
		    u_on_newpos(level->dnladder.sx, level->dnladder.sy);
		} else {
		    if (newdungeon) {
			if (Is_stronghold(&u.uz)) {
			    xchar x, y;
			    const dest_area *udst = &level->updest;
			    int trycnt = 0;

			    do {
				do {
				    x = rn1((udst->hx - udst->lx) + 1, udst->lx);
				    y = rn1((udst->hy - udst->ly) + 1, udst->ly);
				} while ((x < udst->nlx || x > udst->nhx) &&
					 (y < udst->nly || y > udst->nhy));
			    } while ((occupied(level, x, y) ||
				      IS_STWALL(level->locations[x][y].typ)) &&
				     trycnt++ < 1000);
			    if (trycnt >= 1000)
				warning("Castle: placement failed to find good pos");
			    u_on_newpos(x, y);
			} else u_on_sstairs();
		    } else u_on_dnstairs();
		}
		/* Remove bug which crashes with levitation/punishment  KAA */
		if (Punished && !Levitation) {
			pline("With great effort you climb the %s.",
				at_ladder ? "ladder" : "stairs");
		}
	    } else {	/* down */
		if (at_ladder) {
		    u_on_newpos(level->upladder.sx, level->upladder.sy);
		} else {
		    if (newdungeon) u_on_sstairs();
		    else u_on_upstairs();
		}
		if (at_stairs && Flying)
		    pline("You fly down along the %s.",
			at_ladder ? "ladder" : "stairs");
		else if (at_stairs &&
		    (near_capacity() > UNENCUMBERED ||
		     (Punished && (uwep != uball || P_SKILL(P_FLAIL) < P_BASIC ||
				   !Role_if(PM_CONVICT))) ||
		     Fumbling)) {
		    pline("You fall down the %s.", at_ladder ? "ladder" : "stairs");
		    if (Punished) {
			drag_down();
			if (carried(uball)) {
			    if (uwep == uball)
				setuwep(NULL);
			    if (uswapwep == uball)
				setuswapwep(NULL);
			    if (uquiver == uball)
				setuqwep(NULL);
			    freeinv(uball);
			}
		    }
		    /* falling off steed has its own losehp() call */
		    if (u.usteed)
			dismount_steed(DISMOUNT_FELL);
		    else
			losehp(rnd(3), "falling downstairs", KILLED_BY);
		    selftouch("Falling, you");
		}
	    }
	} else {	/* trap door or level_tele or In_endgame */
	    if (was_in_W_tower && On_W_tower_level(&u.uz))
		/* Stay inside the Wizard's tower when feasible.	*/
		/* Note: up vs down doesn't really matter in this case. */
		place_lregion(level, level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				0,0, 0,0, LR_DOWNTELE, NULL);
	    else if (up)
		place_lregion(level, level->updest.lx, level->updest.ly,
				level->updest.hx, level->updest.hy,
				level->updest.nlx, level->updest.nly,
				level->updest.nhx, level->updest.nhy,
				LR_UPTELE, NULL);
	    else
		place_lregion(level, level->dndest.lx, level->dndest.ly,
				level->dndest.hx, level->dndest.hy,
				level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				LR_DOWNTELE, NULL);
	    if (falling) {
		if (Punished) ballfall();
		selftouch("Falling, you");
	    }
	}

	if (Punished) placebc();

	/* only matters if falling;
	 * place objects that fell with the player nearby */
	while (level->objects[0][0]) {
	    deliver_object(level->objects[0][0], u.uz.dnum, u.uz.dlevel,
			   MIGR_NEAR_PLAYER);
	}

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    set_obj_level(level, otmp);
	losedogs();
	kill_genocided_monsters();  /* for those wiped out while in limbo */
	/*
	 * Expire all timers that have gone off while away.  Must be
	 * after migrating monsters and objects are delivered
	 * (losedogs and obj_delivery).
	 */
	run_timers();

	initrack();

	if ((mtmp = m_at(level, u.ux, u.uy)) != 0
		&& mtmp != u.usteed) {
	    /* There's a monster at your target destination; it might be one
	       which accompanied you--see mon_arrive(dogmove.c)--or perhaps
	       it was already here.  Randomly move you to an adjacent spot
	       or else the monster to any nearby location.  Prior to 3.3.0
	       the latter was done unconditionally. */
	    coord cc;

	    if (!rn2(2) &&
		    enexto(&cc, level, u.ux, u.uy, youmonst.data) &&
		    distu(cc.x, cc.y) <= 2)
		u_on_newpos(cc.x, cc.y);	/*[maybe give message here?]*/
	    else
		mnexto(mtmp);

	    if ((mtmp = m_at(level, u.ux, u.uy)) != 0) {
		impossible("mnexto failed (do.c)?");
		rloc(level, mtmp, FALSE);
	    }
	}

	/* Stop autoexplore revisiting the entrance stairs. */
	level->locations[u.ux][u.uy].mem_stepped = 1;

	/* initial movement of bubbles just before vision_recalc */
	if (Is_waterlevel(&u.uz))
		movebubbles();

	if (level->flags.forgotten) {
	    familiar = TRUE;
	    level->flags.forgotten = FALSE;
	}
	
	notify_levelchange(NULL); /* inform window code of the level change */

	/* Reset the screen. */
	vision_reset();		/* reset the blockages */
	doredraw();		/* does a full vision recalc */
	flush_screen_enable();
	flush_screen();

	/*
	 *  Move all plines beyond the screen reset.
	 */

	/* give room entrance message, if any */
	check_special_room(FALSE);

	/* Check whether we just entered Gehennom. */
	if (!In_hell(&u.uz0) && Inhell) {
	    if (Is_valley(&u.uz)) {
		pline("You arrive at the Valley of the Dead...");
		pline("The odor of burnt flesh and decay pervades the air.");
		You_hear("groans and moans everywhere.");
	    } else pline("It is hot here.  You smell smoke...");
	}

	if (familiar) {
	    static const char * const fam_msgs[4] = {
		"You have a sense of deja vu.",
		"You feel like you've been here before.",
		"This place %s familiar...",
		0	/* no message */
	    };
	    static const char * const halu_fam_msgs[4] = {
		"Whoa!  Everything %s different.",
		"You are surrounded by twisty little passages, all alike.",
		"Gee, this %s like uncle Conan's place...",
		0	/* no message */
	    };
	    const char *mesg;
	    char buf[BUFSZ];
	    int which = rn2(4);

	    if (Hallucination)
		mesg = halu_fam_msgs[which];
	    else
		mesg = fam_msgs[which];
	    if (mesg && strchr(mesg, '%')) {
		sprintf(buf, mesg, !Blind ? "looks" : "seems");
		mesg = buf;
	    }
	    if (mesg) pline(mesg);
	}

	if (new && Is_rogue_level(&u.uz))
	    pline("You enter what seems to be an older, more primitive world.");

	if (new && Hallucination && Role_if(PM_ARCHEOLOGIST) &&
		Is_juiblex_level(&u.uz))
	    pline("Ahh, Venice.");

	/* Final confrontation */
	if (In_endgame(&u.uz) && newdungeon && u.uhave.amulet)
		resurrect();
	if (newdungeon && (In_V_tower(&u.uz) || In_dragon(&u.uz)) && In_hell(&u.uz0))
		pline("The heat and smoke are gone.");

	/* the message from your quest leader */
	if (!In_quest(&u.uz0) && at_dgn_entrance(&u.uz, "The Quest") &&
		!(u.uevent.qexpelled || u.uevent.qcompleted || quest_status.leader_is_dead)) {
		if (BTelepat) {
			if (uarmh)
			    pline("You sense something being blocked by %s.",
				  yname(uarmh));
		} else if (u.uevent.qcalled) {
			com_pager(Role_if (PM_ROGUE) ? 4 : 3);
		} else {
			com_pager(2);
			u.uevent.qcalled = TRUE;
		}
	}

	if (getmonth() == 12 && getmday() < 25) {
		if (mk_advcal_portal(level))
			pline("You smell chocolate!");
	}
	if (Is_advent_calendar(&u.uz))
		fill_advent_calendar(level, FALSE);

	/* once Croesus is dead, his alarm doesn't work any more */
	if (Is_knox(&u.uz) && (new || !mvitals[PM_CROESUS].died)) {
		pline("You penetrated a high security area!");
		pline("An alarm sounds!");
		for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
		    if (!DEADMONSTER(mtmp) && mtmp->msleeping) mtmp->msleeping = 0;
	}

	if (Is_blackmarket(&u.uz) && Conflict)
	    set_black_marketeer_angry();

	if (on_level(&u.uz, &astral_level))
	    final_level();
	else
	    onquest();
	assign_level(&u.uz0, &u.uz); /* reset u.uz0 */
	
	if (*level->levname)
	    pline("You named this level: %s.", level->levname);

	/* assume this will always return TRUE when changing level */
	in_out_region(level, u.ux, u.uy);
	pickup(1);
}